

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int local_1c;
  int extra;
  int tostore_local;
  int nelems_local;
  int base_local;
  FuncState *fs_local;
  
  local_1c = tostore;
  if (tostore == -1) {
    local_1c = 0;
  }
  if (nelems < 0x400) {
    luaK_codevABCk(fs,OP_SETLIST,base,local_1c,nelems,0);
  }
  else {
    luaK_codevABCk(fs,OP_SETLIST,base,local_1c,nelems % 0x400,1);
    codeextraarg(fs,nelems / 0x400);
  }
  fs->freereg = (char)base + '\x01';
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  lua_assert(tostore != 0);
  if (tostore == LUA_MULTRET)
    tostore = 0;
  if (nelems <= MAXARG_vC)
    luaK_codevABCk(fs, OP_SETLIST, base, tostore, nelems, 0);
  else {
    int extra = nelems / (MAXARG_vC + 1);
    nelems %= (MAXARG_vC + 1);
    luaK_codevABCk(fs, OP_SETLIST, base, tostore, nelems, 1);
    codeextraarg(fs, extra);
  }
  fs->freereg = cast_byte(base + 1);  /* free registers with list values */
}